

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTreeEdge.cpp
# Opt level: O0

string * __thiscall PhyloTreeEdge::toString_abi_cxx11_(PhyloTreeEdge *this)

{
  ostream *poVar1;
  long in_RSI;
  string *in_RDI;
  ostringstream ss;
  string s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe10;
  ostringstream local_1b8 [392];
  string local_30 [48];
  
  std::__cxx11::string::string(local_30);
  boost::to_string<unsigned_long,std::allocator<unsigned_long>,std::__cxx11::string>
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  std::__cxx11::ostringstream::ostringstream(local_1b8);
  poVar1 = std::operator<<((ostream *)local_1b8,"[");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(double *)(in_RSI + 0x28));
  poVar1 = std::operator<<(poVar1,"] ");
  std::operator<<(poVar1,local_30);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1b8);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

string PhyloTreeEdge::toString() {
    string s;
    boost::to_string(partition, s);
    ostringstream ss;
    ss << "[" << length << "] " << s;
    return ss.str();
}